

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpinternalsourcedata.h
# Opt level: O2

int __thiscall
jrtplib::RTPInternalSourceData::SetRTCPDataAddress(RTPInternalSourceData *this,RTPAddress *a)

{
  RTPAddress *pRVar1;
  int iVar2;
  undefined4 extraout_var;
  
  if (a == (RTPAddress *)0x0) {
    pRVar1 = (this->super_RTPSourceData).rtcpaddr;
    if (pRVar1 != (RTPAddress *)0x0) {
      RTPDelete<jrtplib::RTPAddress>(pRVar1,(this->super_RTPSourceData).super_RTPMemoryObject.mgr);
      (this->super_RTPSourceData).rtcpaddr = (RTPAddress *)0x0;
    }
  }
  else {
    iVar2 = (**a->_vptr_RTPAddress)(a,(this->super_RTPSourceData).super_RTPMemoryObject.mgr);
    if ((RTPAddress *)CONCAT44(extraout_var,iVar2) == (RTPAddress *)0x0) {
      return -1;
    }
    pRVar1 = (this->super_RTPSourceData).rtcpaddr;
    if (pRVar1 != a && pRVar1 != (RTPAddress *)0x0) {
      RTPDelete<jrtplib::RTPAddress>(pRVar1,(this->super_RTPSourceData).super_RTPMemoryObject.mgr);
    }
    (this->super_RTPSourceData).rtcpaddr = (RTPAddress *)CONCAT44(extraout_var,iVar2);
  }
  (this->super_RTPSourceData).isrtcpaddrset = true;
  return 0;
}

Assistant:

inline int RTPInternalSourceData::SetRTCPDataAddress(const RTPAddress *a)
{
	if (a == 0)
	{
		if (rtcpaddr)
		{
			RTPDelete(rtcpaddr,GetMemoryManager());
			rtcpaddr = 0;
		}
	}
	else
	{
		RTPAddress *newaddr = a->CreateCopy(GetMemoryManager());
		if (newaddr == 0)
			return ERR_RTP_OUTOFMEM;
		
		if (rtcpaddr && a != rtcpaddr)
			RTPDelete(rtcpaddr,GetMemoryManager());
		rtcpaddr = newaddr;
	}
	isrtcpaddrset = true;
	return 0;
}